

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void ft_glyphslot_done(FT_GlyphSlot slot)

{
  FT_Driver pFVar1;
  FT_Memory memory_00;
  FT_Memory memory;
  FT_Driver_Class clazz;
  FT_Driver driver;
  FT_GlyphSlot slot_local;
  
  pFVar1 = slot->face->driver;
  memory_00 = (pFVar1->root).memory;
  if (pFVar1->clazz->done_slot != (FT_Slot_DoneFunc)0x0) {
    (*pFVar1->clazz->done_slot)(slot);
  }
  ft_glyphslot_free_bitmap(slot);
  if (slot->internal != (FT_Slot_Internal)0x0) {
    if ((((pFVar1->root).clazz)->module_flags & 0x200) == 0) {
      FT_GlyphLoader_Done(slot->internal->loader);
      slot->internal->loader = (FT_GlyphLoader)0x0;
    }
    ft_mem_free(memory_00,slot->internal);
    slot->internal = (FT_Slot_Internal)0x0;
  }
  return;
}

Assistant:

static void
  ft_glyphslot_done( FT_GlyphSlot  slot )
  {
    FT_Driver        driver = slot->face->driver;
    FT_Driver_Class  clazz  = driver->clazz;
    FT_Memory        memory = driver->root.memory;


    if ( clazz->done_slot )
      clazz->done_slot( slot );

    /* free bitmap buffer if needed */
    ft_glyphslot_free_bitmap( slot );

    /* slot->internal might be NULL in out-of-memory situations */
    if ( slot->internal )
    {
      /* free glyph loader */
      if ( FT_DRIVER_USES_OUTLINES( driver ) )
      {
        FT_GlyphLoader_Done( slot->internal->loader );
        slot->internal->loader = NULL;
      }

      FT_FREE( slot->internal );
    }
  }